

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_set.c
# Opt level: O0

int mpt_config_set(mpt_config *conf,char *path,char *val,int sep,int end)

{
  size_t sVar1;
  int iVar2;
  int *local_68;
  mpt_value d;
  mpt_metatype *gl;
  mpt_path where;
  int end_local;
  int sep_local;
  char *val_local;
  char *path_local;
  mpt_config *conf_local;
  
  gl = (mpt_metatype *)0x0;
  where.base = (char *)0x0;
  where.off = 0;
  where.len = 0x2e0000;
  where._24_4_ = end;
  where._28_4_ = sep;
  _end_local = val;
  val_local = path;
  path_local = (char *)conf;
  if ((conf == (mpt_config *)0x0) &&
     (((d._type = (mpt_type_t)mpt_config_global((mpt_path *)0x0),
       (mpt_metatype *)d._type == (mpt_metatype *)0x0 ||
       (iVar2 = (*(((mpt_metatype *)d._type)->_vptr->convertable).convert)
                          ((mpt_convertable *)d._type,0x85,&path_local), iVar2 < 0)) ||
      (path_local == (char *)0x0)))) {
    conf_local._4_4_ = -4;
  }
  else {
    sVar1 = where.len;
    if (val_local != (char *)0x0) {
      where.len._4_4_ = SUB84(sVar1,4);
      where.len._0_4_ = CONCAT13(where.first,CONCAT12(where._28_1_,(undefined2)where.len));
      mpt_path_set((mpt_path *)&gl,val_local,-1);
    }
    if (_end_local == (char *)0x0) {
      conf_local._4_4_ = (**(code **)(*(long *)path_local + 0x10))(path_local,&gl);
    }
    else {
      local_68 = &end_local;
      d._addr = (void *)0x73;
      conf_local._4_4_ = (**(code **)(*(long *)path_local + 8))(path_local,&gl,&local_68);
    }
  }
  return conf_local._4_4_;
}

Assistant:

extern int mpt_config_set(MPT_INTERFACE(config) *conf, const char *path, const char *val, int sep, int end)
{
	MPT_STRUCT(path) where = MPT_PATH_INIT;
	
	if (!conf) {
		MPT_INTERFACE(metatype) *gl;
		if (!(gl = mpt_config_global(0))
		    || MPT_metatype_convert(gl, MPT_ENUM(TypeConfigPtr), &conf) < 0
		    || !conf) {
			return MPT_ERROR(BadOperation);
		}
	}
	if (path) {
		where.sep = sep;
		where.assign = end;
		(void) mpt_path_set(&where, path, -1);
	}
	if (!val) {
		return conf->_vptr->remove(conf, &where);
	}
	else {
		MPT_STRUCT(value) d = MPT_VALUE_INIT('s', &val);
		return conf->_vptr->assign(conf, &where, &d);
	}
}